

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O1

LispPTR N_OP_car(LispPTR tos)

{
  uint uVar1;
  ulong uVar2;
  
  if ((tos & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)tos);
  }
  if ((*(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
    uVar1 = *(uint *)(Lisp_world + tos);
    uVar2 = (ulong)uVar1;
    if (uVar2 < 0x10000000) {
      if ((uVar1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      uVar1 = *(uint *)(Lisp_world + uVar2) & 0xfffffff;
    }
    else {
      uVar1 = uVar1 & 0xfffffff;
    }
  }
  else {
    uVar1 = tos;
    if ((tos != 0) && (tos != 0x4c)) {
      MachineState.errorexit = 1;
      uVar1 = 0xffffffff;
      MachineState.tosvalue = tos;
    }
  }
  return uVar1;
}

Assistant:

LispPTR N_OP_car(LispPTR tos) {
  ConsCell *datum68k;
  ConsCell *temp;

  datum68k = (ConsCell *)(NativeAligned4FromLAddr(tos));
  if (Listp(tos)) {
    if (datum68k->cdr_code == CDR_INDIRECT) {
      temp = (ConsCell *)NativeAligned4FromLAddr(datum68k->car_field);
      return ((LispPTR)temp->car_field);
    } else
      return ((LispPTR)datum68k->car_field);
  } else if (tos == NIL_PTR)
    return (tos);
  else if (tos == ATOM_T)
    return (tos);
  else {
    ERROR_EXIT(tos);
  }
}